

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::detail::dtoa_impl::grisu2<double>
               (char *buf,int *len,int *decimal_exponent,double value)

{
  diyfp v;
  diyfp m_plus;
  bool bVar1;
  diyfp m_minus;
  undefined1 local_58 [8];
  boundaries w;
  double value_local;
  int *decimal_exponent_local;
  int *len_local;
  char *buf_local;
  
  w.plus._8_8_ = value;
  bVar1 = std::isfinite(value);
  if (!bVar1) {
    __assert_fail("std::isfinite(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                  ,0x3b7a,
                  "void nlohmann::detail::dtoa_impl::grisu2(char *, int &, int &, FloatType) [FloatType = double]"
                 );
  }
  if (0.0 < (double)w.plus._8_8_) {
    compute_boundaries<double>((boundaries *)local_58,(double)w.plus._8_8_);
    m_minus.e = (undefined4)w.minus.f;
    m_minus.f = w.w._8_8_;
    v._8_8_ = w.w.f;
    v.f = (uint64_t)local_58;
    m_plus._8_8_ = w.plus.f;
    m_plus.f = w.minus._8_8_;
    m_minus._12_4_ = 0;
    grisu2(buf,len,decimal_exponent,m_minus,v,m_plus);
    return;
  }
  __assert_fail("value > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                ,0x3b7b,
                "void nlohmann::detail::dtoa_impl::grisu2(char *, int &, int &, FloatType) [FloatType = double]"
               );
}

Assistant:

JSON_HEDLEY_NON_NULL(1)
                void grisu2(char* buf, int& len, int& decimal_exponent, FloatType value)
            {
                static_assert(diyfp::kPrecision >= std::numeric_limits<FloatType>::digits + 3,
                    "internal error: not enough precision");

                JSON_ASSERT(std::isfinite(value));
                JSON_ASSERT(value > 0);

                // If the neighbors (and boundaries) of 'value' are always computed for double-precision
                // numbers, all float's can be recovered using strtod (and strtof). However, the resulting
                // decimal representations are not exactly "short".
                //
                // The documentation for 'std::to_chars' (https://en.cppreference.com/w/cpp/utility/to_chars)
                // says "value is converted to a string as if by std::sprintf in the default ("C") locale"
                // and since sprintf promotes float's to double's, I think this is exactly what 'std::to_chars'
                // does.
                // On the other hand, the documentation for 'std::to_chars' requires that "parsing the
                // representation using the corresponding std::from_chars function recovers value exactly". That
                // indicates that single precision floating-point numbers should be recovered using
                // 'std::strtof'.
                //
                // NB: If the neighbors are computed for single-precision numbers, there is a single float
                //     (7.0385307e-26f) which can't be recovered using strtod. The resulting double precision
                //     value is off by 1 ulp.
#if 0
                const boundaries w = compute_boundaries(static_cast<double>(value));
#else
                const boundaries w = compute_boundaries(value);
#endif

                grisu2(buf, len, decimal_exponent, w.minus, w.w, w.plus);
            }